

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ann.cpp
# Opt level: O2

double __thiscall ANN::net_error(ANN *this,Matrix *error)

{
  double dVar1;
  Shape *pSVar2;
  vector<double,_std::allocator<double>_> *pvVar3;
  uint i;
  ulong uVar4;
  double local_18;
  
  local_18 = 0.0;
  uVar4 = 0;
  while( true ) {
    pSVar2 = Matrix::shape(error);
    if ((pSVar2->field_0).m_dims[1] <= uVar4) break;
    pvVar3 = Matrix::operator[](error,0);
    dVar1 = (pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar4];
    local_18 = local_18 + dVar1 * dVar1 * 0.5;
    uVar4 = uVar4 + 1;
  }
  return local_18;
}

Assistant:

double ANN::net_error(const Matrix& error) const{
    double err=0.;

    for(uint i=0;i<error.shape().n_col;++i){
        err+=0.5*pow(error[0][i], 2);
    }

    return err;
}